

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::UpdateEdges
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker,EdgeAllocator *alloc,bool disjoint_from_index)

{
  value_type pCVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference ppCVar5;
  R1Interval *pRVar6;
  ClippedEdge *pCVar7;
  ShapeIdSet *pSVar8;
  double dVar9;
  double dVar10;
  pointer *local_450;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *local_270;
  byte local_219;
  S2PaddedCell local_218;
  int local_1b4;
  int local_1b0;
  int j_2;
  int i_2;
  int pos;
  int local_190;
  int local_18c;
  int j_1;
  int i_1;
  ClippedEdge *right;
  ClippedEdge *left;
  ClippedEdge *local_170;
  ClippedEdge *local_168;
  ClippedEdge *local_160;
  value_type local_158;
  ClippedEdge *edge;
  R2Rect *pRStack_148;
  int e;
  R2Rect *middle;
  size_t alloc_size;
  int local_130;
  int j;
  int i;
  int num_edges;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  child_edges [2] [2];
  S2LogMessage local_c0;
  S2LogMessageVoidify local_ad;
  uint64 local_ac;
  CellRelation local_a4;
  undefined1 local_a0 [4];
  CellRelation r;
  Iterator iter;
  bool index_cell_absorbed;
  S2LogMessage local_48;
  S2LogMessageVoidify local_32;
  byte local_31;
  EdgeAllocator *pEStack_30;
  bool disjoint_from_index_local;
  EdgeAllocator *alloc_local;
  InteriorTracker *tracker_local;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *edges_local;
  S2PaddedCell *pcell_local;
  MutableS2ShapeIndex *this_local;
  
  local_31 = disjoint_from_index;
  pEStack_30 = alloc;
  alloc_local = (EdgeAllocator *)tracker;
  tracker_local = (InteriorTracker *)edges;
  edges_local = (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)pcell;
  pcell_local = (S2PaddedCell *)this;
  bVar2 = std::
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ::empty(edges);
  local_219 = 1;
  if (bVar2) {
    pSVar8 = InteriorTracker::shape_ids((InteriorTracker *)alloc_local);
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(pSVar8);
    local_219 = bVar2 ^ 0xff;
  }
  if (((local_219 ^ 0xff) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x3fe,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_48);
    poVar3 = std::operator<<(poVar3,
                             "Check failed: !edges->empty() || !tracker->shape_ids().empty() ");
    S2LogMessageVoidify::operator&(&local_32,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  iter.end_.position._3_1_ = 0;
  if ((local_31 & 1) == 0) {
    Iterator::Iterator((Iterator *)local_a0);
    Iterator::InitStale((Iterator *)local_a0,this,UNPOSITIONED);
    local_ac = (uint64)S2PaddedCell::id((S2PaddedCell *)edges_local);
    local_a4 = Iterator::Locate((Iterator *)local_a0,(S2CellId)local_ac);
    if (local_a4 == DISJOINT) {
      local_31 = 1;
    }
    else if (local_a4 == INDEXED) {
      AbsorbIndexCell(this,(S2PaddedCell *)edges_local,(Iterator *)local_a0,
                      (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                       *)tracker_local,(InteriorTracker *)alloc_local,pEStack_30);
      iter.end_.position._3_1_ = 1;
      local_31 = 1;
    }
    else {
      child_edges[1][1].
      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      if (local_a4 != SUBDIVIDED) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                   ,0x428,kFatal,(ostream *)&std::cerr);
        child_edges[1][1].
        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        poVar3 = S2LogMessage::stream(&local_c0);
        poVar3 = std::operator<<(poVar3,"Check failed: (SUBDIVIDED) == (r) ");
        S2LogMessageVoidify::operator&(&local_ad,poVar3);
      }
      if ((child_edges[1][1].
           super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_c0);
      }
    }
    Iterator::~Iterator((Iterator *)local_a0);
  }
  if (((local_31 & 1) == 0) ||
     (bVar2 = MakeIndexCell(this,(S2PaddedCell *)edges_local,
                            (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                             *)tracker_local,(InteriorTracker *)alloc_local), !bVar2)) {
    local_270 = (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)&i;
    do {
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::vector(local_270);
      local_270 = local_270 + 1;
    } while (local_270 !=
             (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              *)&child_edges[1][1].
                 super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar4 = std::
            vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            ::size((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    *)tracker_local);
    j = (int)sVar4;
    for (local_130 = 0; local_130 < 2; local_130 = local_130 + 1) {
      for (alloc_size._4_4_ = 0; alloc_size._4_4_ < 2; alloc_size._4_4_ = alloc_size._4_4_ + 1) {
        std::
        vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        ::reserve((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)(&i + (long)local_130 * 0xc + (long)alloc_size._4_4_ * 6),(long)j);
      }
    }
    middle = (R2Rect *)EdgeAllocator::size(pEStack_30);
    pRStack_148 = S2PaddedCell::middle((S2PaddedCell *)edges_local);
    for (edge._4_4_ = 0; edge._4_4_ < j; edge._4_4_ = edge._4_4_ + 1) {
      ppCVar5 = std::
                vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                ::operator[]((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                              *)tracker_local,(long)edge._4_4_);
      local_158 = *ppCVar5;
      pRVar6 = R2Rect::operator[](&local_158->bound,0);
      dVar9 = R1Interval::hi(pRVar6);
      pRVar6 = R2Rect::operator[](pRStack_148,0);
      dVar10 = R1Interval::lo(pRVar6);
      pCVar1 = local_158;
      if (dVar10 < dVar9) {
        pRVar6 = R2Rect::operator[](&local_158->bound,0);
        dVar9 = R1Interval::lo(pRVar6);
        pRVar6 = R2Rect::operator[](pRStack_148,0);
        dVar10 = R1Interval::hi(pRVar6);
        pCVar1 = local_158;
        if (dVar9 < dVar10) {
          pRVar6 = R2Rect::operator[](&local_158->bound,1);
          dVar9 = R1Interval::hi(pRVar6);
          pRVar6 = R2Rect::operator[](pRStack_148,1);
          dVar10 = R1Interval::lo(pRVar6);
          pCVar1 = local_158;
          if (dVar10 < dVar9) {
            pRVar6 = R2Rect::operator[](&local_158->bound,1);
            dVar9 = R1Interval::lo(pRVar6);
            pRVar6 = R2Rect::operator[](pRStack_148,1);
            dVar10 = R1Interval::hi(pRVar6);
            pCVar1 = local_158;
            if (dVar9 < dVar10) {
              pRVar6 = R2Rect::operator[](pRStack_148,0);
              dVar9 = R1Interval::hi(pRVar6);
              pCVar7 = ClipUBound(pCVar1,1,dVar9,pEStack_30);
              right = pCVar7;
              pRVar6 = R2Rect::operator[](pRStack_148,1);
              ClipVAxis(pCVar7,pRVar6,
                        (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         *)&i,pEStack_30);
              pCVar1 = local_158;
              pRVar6 = R2Rect::operator[](pRStack_148,0);
              dVar9 = R1Interval::lo(pRVar6);
              pCVar7 = ClipUBound(pCVar1,0,dVar9,pEStack_30);
              _j_1 = pCVar7;
              pRVar6 = R2Rect::operator[](pRStack_148,1);
              ClipVAxis(pCVar7,pRVar6,
                        (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         *)&child_edges[0][1].
                            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pEStack_30);
            }
            else {
              pRVar6 = R2Rect::operator[](pRStack_148,0);
              dVar9 = R1Interval::hi(pRVar6);
              local_170 = ClipUBound(pCVar1,1,dVar9,pEStack_30);
              std::
              vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                           *)&child_edges[0][0].
                              super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_170);
              pCVar1 = local_158;
              pRVar6 = R2Rect::operator[](pRStack_148,0);
              dVar9 = R1Interval::lo(pRVar6);
              left = ClipUBound(pCVar1,0,dVar9,pEStack_30);
              std::
              vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                           *)&child_edges[1][0].
                              super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&left);
            }
          }
          else {
            pRVar6 = R2Rect::operator[](pRStack_148,0);
            dVar9 = R1Interval::hi(pRVar6);
            local_160 = ClipUBound(pCVar1,1,dVar9,pEStack_30);
            std::
            vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         *)&i,&local_160);
            pCVar1 = local_158;
            pRVar6 = R2Rect::operator[](pRStack_148,0);
            dVar9 = R1Interval::lo(pRVar6);
            local_168 = ClipUBound(pCVar1,0,dVar9,pEStack_30);
            std::
            vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            ::push_back((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         *)&child_edges[0][1].
                            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_168);
          }
        }
        else {
          pRVar6 = R2Rect::operator[](pRStack_148,1);
          ClipVAxis(pCVar1,pRVar6,
                    (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     *)&child_edges[0][1].
                        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pEStack_30);
        }
      }
      else {
        pRVar6 = R2Rect::operator[](pRStack_148,1);
        ClipVAxis(pCVar1,pRVar6,
                  (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)&i,pEStack_30);
      }
    }
    for (local_18c = 0; local_18c < 2; local_18c = local_18c + 1) {
      for (local_190 = 0; local_190 < 2; local_190 = local_190 + 1) {
        bVar2 = std::
                vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                ::empty((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         *)(&i + (long)local_18c * 0xc + (long)local_190 * 6));
        if (bVar2) {
          memset(&i_2,0,0x18);
          std::
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ::vector((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    *)&i_2);
          std::
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ::swap((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  *)&i_2,(vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                          *)(&i + (long)local_18c * 0xc + (long)local_190 * 6));
          std::
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ::~vector((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     *)&i_2);
        }
      }
    }
    for (j_2 = 0; j_2 < 4; j_2 = j_2 + 1) {
      S2PaddedCell::GetChildIJ((S2PaddedCell *)edges_local,j_2,&local_1b0,&local_1b4);
      bVar2 = std::
              vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ::empty((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                       *)(&i + (long)local_1b0 * 0xc + (long)local_1b4 * 6));
      if (bVar2) {
        pSVar8 = InteriorTracker::shape_ids((InteriorTracker *)alloc_local);
        bVar2 = std::vector<int,_std::allocator<int>_>::empty(pSVar8);
        if (!bVar2) goto LAB_0038a147;
      }
      else {
LAB_0038a147:
        S2PaddedCell::S2PaddedCell(&local_218,(S2PaddedCell *)edges_local,local_1b0,local_1b4);
        UpdateEdges(this,&local_218,
                    (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     *)(&i + (long)local_1b0 * 0xc + (long)local_1b4 * 6),
                    (InteriorTracker *)alloc_local,pEStack_30,(bool)(local_31 & 1));
      }
    }
    EdgeAllocator::Reset(pEStack_30,(size_t)middle);
    local_450 = &child_edges[1][1].
                 super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_450 = local_450 + -3;
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::~vector((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)local_450);
    } while (local_450 != (pointer *)&i);
  }
  if ((iter.end_.position._3_1_ & 1) != 0) {
    InteriorTracker::RestoreStateBefore
              ((InteriorTracker *)alloc_local,this->pending_additions_begin_);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateEdges(const S2PaddedCell& pcell,
                                      vector<const ClippedEdge*>* edges,
                                      InteriorTracker* tracker,
                                      EdgeAllocator* alloc,
                                      bool disjoint_from_index) {
  // Cases where an index cell is not needed should be detected before this.
  S2_DCHECK(!edges->empty() || !tracker->shape_ids().empty());

  // This function is recursive with a maximum recursion depth of 30
  // (S2CellId::kMaxLevel).  Note that using an explicit stack does not seem
  // to be any faster based on profiling.

  // Incremental updates are handled as follows.  All edges being added or
  // removed are combined together in "edges", and all shapes with interiors
  // are tracked using "tracker".  We subdivide recursively as usual until we
  // encounter an existing index cell.  At this point we "absorb" the index
  // cell as follows:
  //
  //   - Edges and shapes that are being removed are deleted from "edges" and
  //     "tracker".
  //   - All remaining edges and shapes from the index cell are added to
  //     "edges" and "tracker".
  //   - Continue subdividing recursively, creating new index cells as needed.
  //   - When the recursion gets back to the cell that was absorbed, we
  //     restore "edges" and "tracker" to their previous state.
  //
  // Note that the only reason that we include removed shapes in the recursive
  // subdivision process is so that we can find all of the index cells that
  // contain those shapes efficiently, without maintaining an explicit list of
  // index cells for each shape (which would be expensive in terms of memory).
  bool index_cell_absorbed = false;
  if (!disjoint_from_index) {
    // There may be existing index cells contained inside "pcell".  If we
    // encounter such a cell, we need to combine the edges being updated with
    // the existing cell contents by "absorbing" the cell.
    // Use InitStale() to avoid applying updated recursively.
    Iterator iter;
    iter.InitStale(this);
    CellRelation r = iter.Locate(pcell.id());
    if (r == DISJOINT) {
      disjoint_from_index = true;
    } else if (r == INDEXED) {
      // Absorb the index cell by transferring its contents to "edges" and
      // deleting it.  We also start tracking the interior of any new shapes.
      AbsorbIndexCell(pcell, iter, edges, tracker, alloc);
      index_cell_absorbed = true;
      disjoint_from_index = true;
    } else {
      S2_DCHECK_EQ(SUBDIVIDED, r);
    }
  }

  // If there are existing index cells below us, then we need to keep
  // subdividing so that we can merge with those cells.  Otherwise,
  // MakeIndexCell checks if the number of edges is small enough, and creates
  // an index cell if possible (returning true when it does so).
  if (!disjoint_from_index || !MakeIndexCell(pcell, *edges, tracker)) {
    // Reserve space for the edges that will be passed to each child.  This is
    // important since otherwise the running time is dominated by the time
    // required to grow the vectors.  The amount of memory involved is
    // relatively small, so we simply reserve the maximum space for every child.
    vector<const ClippedEdge*> child_edges[2][2];  // [i][j]
    int num_edges = edges->size();
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        child_edges[i][j].reserve(num_edges);
      }
    }

    // Remember the current size of the EdgeAllocator so that we can free any
    // edges that are allocated during edge splitting.
    size_t alloc_size = alloc->size();

    // Compute the middle of the padded cell, defined as the rectangle in
    // (u,v)-space that belongs to all four (padded) children.  By comparing
    // against the four boundaries of "middle" we can determine which children
    // each edge needs to be propagated to.
    const R2Rect& middle = pcell.middle();

    // Build up a vector edges to be passed to each child cell.  The (i,j)
    // directions are left (i=0), right (i=1), lower (j=0), and upper (j=1).
    // Note that the vast majority of edges are propagated to a single child.
    // This case is very fast, consisting of between 2 and 4 floating-point
    // comparisons and copying one pointer.  (ClipVAxis is inline.)
    for (int e = 0; e < num_edges; ++e) {
      const ClippedEdge* edge = (*edges)[e];
      if (edge->bound[0].hi() <= middle[0].lo()) {
        // Edge is entirely contained in the two left children.
        ClipVAxis(edge, middle[1], child_edges[0], alloc);
      } else if (edge->bound[0].lo() >= middle[0].hi()) {
        // Edge is entirely contained in the two right children.
        ClipVAxis(edge, middle[1], child_edges[1], alloc);
      } else if (edge->bound[1].hi() <= middle[1].lo()) {
        // Edge is entirely contained in the two lower children.
        child_edges[0][0].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][0].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else if (edge->bound[1].lo() >= middle[1].hi()) {
        // Edge is entirely contained in the two upper children.
        child_edges[0][1].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][1].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else {
        // The edge bound spans all four children.  The edge itself intersects
        // either three or four (padded) children.
        const ClippedEdge* left = ClipUBound(edge, 1, middle[0].hi(), alloc);
        ClipVAxis(left, middle[1], child_edges[0], alloc);
        const ClippedEdge* right = ClipUBound(edge, 0, middle[0].lo(), alloc);
        ClipVAxis(right, middle[1], child_edges[1], alloc);
      }
    }
    // Free any memory reserved for children that turned out to be empty.  This
    // step is cheap and reduces peak memory usage by about 10% when building
    // large indexes (> 10M edges).
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        if (child_edges[i][j].empty()) {
          vector<const ClippedEdge*>().swap(child_edges[i][j]);
        }
      }
    }
    // Now recursively update the edges in each child.  We call the children in
    // increasing order of S2CellId so that when the index is first constructed,
    // all insertions into cell_map_ are at the end (which is much faster).
    for (int pos = 0; pos < 4; ++pos) {
      int i, j;
      pcell.GetChildIJ(pos, &i, &j);
      if (!child_edges[i][j].empty() || !tracker->shape_ids().empty()) {
        UpdateEdges(S2PaddedCell(pcell, i, j), &child_edges[i][j],
                    tracker, alloc, disjoint_from_index);
      }
    }
    // Free any temporary edges that were allocated during clipping.
    alloc->Reset(alloc_size);
  }
  if (index_cell_absorbed) {
    // Restore the state for any edges being removed that we are tracking.
    tracker->RestoreStateBefore(pending_additions_begin_);
  }
}